

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O3

int set_field_buffer(FIELD *field,int buffer,char *value)

{
  byte bVar1;
  char *pcVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  int *piVar6;
  size_t sVar7;
  ushort **ppuVar8;
  char *pcVar9;
  char cVar10;
  uint uVar11;
  long lVar12;
  char *pcVar13;
  char *pcVar14;
  uint uVar15;
  uint uVar17;
  bool bVar18;
  uint uVar16;
  
  if ((((buffer < 0) || (field == (FIELD *)0x0)) || (value == (char *)0x0)) ||
     (field->nbuf < buffer)) {
LAB_0039fdff:
    iVar5 = -2;
  }
  else {
    uVar17 = field->dcols * field->drows;
    if ((buffer == 0) && (bVar1 = *value, uVar17 != 0 && bVar1 != 0)) {
      ppuVar8 = __ctype_b_loc();
      lVar12 = 1;
      do {
        if ((*(byte *)((long)*ppuVar8 + (ulong)bVar1 * 2 + 1) & 0x40) == 0) goto LAB_0039fdff;
        bVar1 = value[lVar12];
      } while ((bVar1 != 0) && (uVar11 = (uint)lVar12, lVar12 = lVar12 + 1, uVar11 < uVar17));
    }
    uVar11 = uVar17;
    if ((field->status & 8) != 0) {
      sVar7 = strlen(value);
      uVar16 = (uint)sVar7;
      uVar15 = uVar16 - uVar17;
      if (uVar17 <= uVar16 && uVar15 != 0) {
        _Var3 = Field_Grown(field,uVar15 / (uint)((int)field->cols *
                                                 ((int)field->rows + field->nrow)) + 1);
        iVar5 = -1;
        if (!_Var3) goto LAB_0039fe05;
        uVar11 = uVar16;
        if (buffer == 0) {
          ppuVar8 = __ctype_b_loc();
          lVar12 = 0;
          do {
            if ((*(byte *)((long)*ppuVar8 + (long)value[lVar12 + (ulong)uVar17] * 2 + 1) & 0x40) ==
                0) goto LAB_0039fdff;
            lVar12 = lVar12 + 1;
          } while (uVar15 != (uint)lVar12);
        }
      }
    }
    pcVar9 = field->buf + (field->dcols * field->drows + 1) * buffer;
    cVar10 = *value;
    bVar18 = uVar11 != 0;
    pcVar13 = value;
    if (cVar10 != '\0' && bVar18) {
      pcVar14 = pcVar9;
      pcVar2 = value + 1;
      do {
        pcVar13 = pcVar2;
        *pcVar14 = cVar10;
        cVar10 = *pcVar13;
        bVar18 = pcVar13 < value + uVar11;
        if (cVar10 == '\0') break;
        pcVar14 = pcVar14 + 1;
        pcVar2 = pcVar13 + 1;
      } while (pcVar13 < value + uVar11);
    }
    if (bVar18) {
      pcVar9[(int)((long)pcVar13 - (long)value)] = cVar10;
      uVar17 = (int)(pcVar9 + ((long)pcVar13 - (long)value)) - (int)pcVar9;
      if (uVar11 < uVar17) {
        __assert_fail("len >= (unsigned int)(s-p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CursesDialog/form/frm_driver.c"
                      ,0xf09,"int set_field_buffer(FIELD *, int, const char *)");
      }
      if (uVar11 >= uVar17 && uVar11 - uVar17 != 0) {
        memset(pcVar9 + ((long)pcVar13 - (long)value),0x20,(ulong)(uVar11 - uVar17));
      }
    }
    iVar5 = 0;
    if (buffer == 0) {
      iVar4 = Synchronize_Field(field);
      iVar5 = Synchronize_Linked_Fields(field);
      if (iVar5 == 0) {
        iVar5 = iVar4;
      }
      if (iVar4 != 0) {
        iVar5 = iVar4;
      }
    }
  }
LAB_0039fe05:
  piVar6 = __errno_location();
  *piVar6 = iVar5;
  return iVar5;
}

Assistant:

int set_field_buffer(FIELD * field, int buffer, const char * value)
{
  char *s, *p;
  int res = E_OK;
  unsigned int len;

  if ( !field || !value || ((buffer < 0)||(buffer > field->nbuf)) )
    RETURN(E_BAD_ARGUMENT);

  len  = Buffer_Length(field);

  if (buffer==0)
    {
      const char *v;
      unsigned int i = 0;

      for(v=value; *v && (i<len); v++,i++)
        {
          if (!isprint((unsigned char)*v))
            RETURN(E_BAD_ARGUMENT);
        }
    }

  if (Growable(field))
    {
      /* for a growable field we must assume zero terminated strings, because
         somehow we have to detect the length of what should be copied.
      */
      unsigned int vlen = strlen(value);
      if (vlen > len)
        {
          if (!Field_Grown(field,
                           (int)(1 + (vlen-len)/((field->rows+field->nrow)*field->cols))))
            RETURN(E_SYSTEM_ERROR);

          /* in this case we also have to check, whether or not the remaining
             characters in value are also printable for buffer 0. */
          if (buffer==0)
            {
              unsigned int i;
          
              for(i=len; i<vlen; i++)
                if (!isprint((int)(value[i])))
                  RETURN(E_BAD_ARGUMENT);
            }
          len = vlen;
        }
    }
  
  p   = Address_Of_Nth_Buffer(field,buffer);

#if HAVE_MEMCCPY
  s = memccpy(p,value,0,len);
#else
  for(s=(char *)value; *s && (s < (value+len)); s++)
    p[s-value] = *s;
  if (s < (value+len))
    {
      int off = s-value;
      p[off] = *s++;
      s = p + (s-value);
    }
  else 
    s=(char *)0;
#endif

  if (s) 
    { /* this means, value was null terminated and not greater than the
         buffer. We have to pad with blanks. Please note that due to memccpy
         logic s points after the terminating null. */
      s--; /* now we point to the terminator. */
      assert(len >= (unsigned int)(s-p));
      if (len > (unsigned int)(s-p))
        memset(s,C_BLANK,len-(unsigned int)(s-p));
    }

  if (buffer==0)
    {
      int syncres;
      if (((syncres=Synchronize_Field( field ))!=E_OK) && 
          (res==E_OK))
        res = syncres;
      if (((syncres=Synchronize_Linked_Fields(field ))!=E_OK) &&
          (res==E_OK))
        res = syncres;
    }
  RETURN(res);
}